

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

void __thiscall NaPetriNet::link_nodes(NaPetriNet *this,NaPetriNode *pNode0,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  NaPetriNode *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  NaException exCode;
  char *szExMsg;
  va_list val;
  NaPetriNode *pNodePrev;
  NaPetriNode *pNodeCur;
  undefined8 *local_178;
  undefined8 local_108 [4];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  uint local_38;
  undefined8 *local_30;
  NaPetriNode *local_20;
  NaPetriNode *local_18;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
  }
  local_20 = (NaPetriNode *)0x0;
  local_30 = (undefined8 *)&stack0x00000008;
  local_38 = 0x10;
  local_108[2] = in_RDX;
  local_108[3] = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_18 = in_RSI;
  while (local_18 != (NaPetriNode *)0x0) {
    if (local_20 != (NaPetriNode *)0x0) {
      iVar1 = (*local_20->_vptr_NaPetriNode[9])();
      if (CONCAT44(extraout_var,iVar1) == 0) {
        pcVar3 = NaPetriNode::name(local_20);
        NaPrintLog("Undefined mainstream output connector for node \'%s\'\n",pcVar3);
      }
      else {
        iVar1 = (*local_18->_vptr_NaPetriNode[8])();
        if (CONCAT44(extraout_var_00,iVar1) == 0) {
          pcVar3 = NaPetriNode::name(local_18);
          NaPrintLog("Undefined mainstream input connector for node \'%s\'\n",pcVar3);
        }
        else {
          iVar1 = (*local_20->_vptr_NaPetriNode[9])();
          iVar2 = (*local_18->_vptr_NaPetriNode[8])();
          (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1,iVar2);
        }
      }
    }
    local_20 = local_18;
    if (local_38 < 0x29) {
      local_178 = (undefined8 *)((long)local_108 + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_178 = local_30;
      local_30 = local_30 + 1;
    }
    local_18 = (NaPetriNode *)*local_178;
  }
  return;
}

Assistant:

void
NaPetriNet::link_nodes (NaPetriNode* pNode0, ...)
{
    NaPetriNode *pNodeCur, *pNodePrev;
    va_list     val;
    const char  *szExMsg =
        "Broken mainstream chain from '%s' to '%s' node.\n"
        "Caused by exception: %s\n";

    pNodePrev = NULL;
    pNodeCur = pNode0;

    for(va_start(val, pNode0);
        NULL != pNodeCur;
        pNodeCur = va_arg(val, NaPetriNode*)){

        // Link prev with current
        if(NULL != pNodePrev){
            try{
                if(NULL == pNodePrev->main_output_cn()){
                    NaPrintLog("Undefined mainstream output connector"
                               " for node '%s'\n", pNodePrev->name());
                }else if(NULL == pNodeCur->main_input_cn()){
                    NaPrintLog("Undefined mainstream input connector"
                               " for node '%s'\n", pNodeCur->name());
                }else{
                    link(pNodePrev->main_output_cn(),
                         pNodeCur->main_input_cn());
                }
            }catch(NaException exCode){
                NaPrintLog(szExMsg, pNodePrev->name(), pNodeCur->name(),
                           NaExceptionMsg(exCode));
            }
        }
        pNodePrev = pNodeCur;
    }

    va_end(val);
}